

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LabelMaxSizeCase::iterate(LabelMaxSizeCase *this)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  GLuint GVar4;
  bool bVar5;
  deBool dVar6;
  int iVar7;
  NotSupportedError *this_00;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  TestError *this_01;
  size_type sVar11;
  reference pvVar12;
  Enum<int,_2UL> EVar13;
  allocator<char> local_1d39;
  string local_1d38;
  string local_1d18;
  int local_1cf4;
  string local_1cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c90;
  GetNameFunc local_1c70;
  int local_1c68;
  GetNameFunc local_1c60;
  int local_1c58;
  string local_1c50;
  allocator<char> local_1c29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bc8;
  int local_1ba4;
  undefined1 local_1ba0 [4];
  deUint32 err_10;
  GetNameFunc local_1a20;
  int local_1a18;
  GetNameFunc local_1a10;
  int local_1a08;
  string local_1a00;
  allocator<char> local_19d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1978;
  int local_1958;
  int local_1954;
  deUint32 err_9;
  allocator<char> local_17c9;
  string local_17c8;
  string local_17a8;
  int local_1784;
  string local_1780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1720;
  GetNameFunc local_1700;
  int local_16f8;
  GetNameFunc local_16f0;
  int local_16e8;
  string local_16e0;
  allocator<char> local_16b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1658;
  int local_1634;
  undefined1 local_1630 [4];
  deUint32 err_8;
  GetNameFunc local_14b0;
  int local_14a8;
  GetNameFunc local_14a0;
  int local_1498;
  string local_1490;
  allocator<char> local_1469;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1408;
  int local_13e4;
  undefined1 local_13e0 [4];
  deUint32 err_7;
  allocator_type local_125a;
  value_type local_1259;
  undefined1 local_1258 [8];
  vector<char,_std::allocator<char>_> readBuffer_1;
  undefined1 local_1238 [8];
  vector<char,_std::allocator<char>_> buffer_1;
  string local_1218;
  allocator<char> local_11f1;
  string local_11f0;
  ScopedLogSection local_11d0;
  ScopedLogSection section_1;
  string local_11c0;
  string local_11a0;
  int local_117c;
  string local_1178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  GetNameFunc local_10f8;
  int local_10f0;
  GetNameFunc local_10e8;
  int local_10e0;
  string local_10d8;
  allocator<char> local_10b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  int local_102c;
  undefined1 local_1028 [4];
  deUint32 err_6;
  GetNameFunc local_ea8;
  int local_ea0;
  GetNameFunc local_e98;
  int local_e90;
  string local_e88;
  allocator<char> local_e61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e00;
  int local_de0;
  int local_ddc;
  deUint32 err_5;
  allocator<char> local_c51;
  string local_c50;
  string local_c30;
  int local_c0c;
  string local_c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  GetNameFunc local_b88;
  int local_b80;
  GetNameFunc local_b78;
  int local_b70;
  string local_b68;
  allocator<char> local_b41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  int local_abc;
  undefined1 local_ab8 [4];
  deUint32 err_4;
  GetNameFunc local_938;
  int local_930;
  GetNameFunc local_928;
  int local_920;
  string local_918;
  allocator<char> local_8f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  int local_86c;
  undefined1 local_868 [4];
  deUint32 err_3;
  allocator_type local_6e2;
  value_type local_6e1;
  undefined1 local_6e0 [8];
  vector<char,_std::allocator<char>_> readBuffer;
  undefined1 local_6c0 [8];
  vector<char,_std::allocator<char>_> buffer;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  ScopedLogSection local_658;
  ScopedLogSection section;
  TestLog *local_640;
  int local_638;
  string local_630;
  allocator<char> local_609;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  int local_584;
  GetNameFunc p_Stack_580;
  deUint32 err_2;
  int local_578;
  GetNameFunc local_570;
  int local_568;
  string local_560;
  allocator<char> local_539;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  int local_4b8;
  undefined4 local_4b4;
  deUint32 err_1;
  undefined1 local_32a;
  allocator<char> local_329;
  string local_328;
  MessageBuilder local_308;
  GetNameFunc local_188;
  int local_180;
  GetNameFunc local_178;
  int local_170;
  string local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  int local_bc;
  undefined8 uStack_b8;
  deUint32 err;
  GLsync sync;
  GLuint shader;
  int outlen;
  int maxLabelLen;
  undefined1 local_80 [8];
  ResultCollector result;
  Functions *gl;
  LabelMaxSizeCase *this_local;
  
  do {
    dVar6 = ::deGetFalse();
    if ((dVar6 != 0) || (bVar5 = isKHRDebugSupported((this->super_TestCase).m_context), !bVar5)) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                 ,0x959);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar8->_vptr_RenderContext[3])();
  result.m_message.field_2._8_8_ = CONCAT44(extraout_var,iVar7);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxLabelLen," // ERROR: ",(allocator<char> *)((long)&outlen + 3));
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_80,pTVar9,(string *)&maxLabelLen);
  std::__cxx11::string::~string((string *)&maxLabelLen);
  std::allocator<char>::~allocator((allocator<char> *)((long)&outlen + 3));
  shader = 0xffffffff;
  sync._4_4_ = -1;
  (**(code **)(result.m_message.field_2._8_8_ + 0x868))(0x82e8,&shader);
  do {
    local_bc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
    if (local_bc != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Got Error ",&local_141);
      EVar13 = glu::getErrorStr(local_bc);
      local_188 = EVar13.m_getName;
      local_180 = EVar13.m_value;
      local_178 = local_188;
      local_170 = local_180;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_168,&local_178);
      std::operator+(&local_120,&local_140,&local_168);
      std::operator+(&local_100,&local_120,": ");
      std::operator+(&local_e0,&local_100,"GL_MAX_LABEL_LENGTH");
      tcu::ResultCollector::fail((ResultCollector *)local_80,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_308,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_308,(char (*) [23])"GL_MAX_LABEL_LENGTH = ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&shader);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_308);
  if (0xff < (int)shader) {
    if ((int)shader < 0x2001) {
      uStack_b8 = (**(code **)(result.m_message.field_2._8_8_ + 0x640))(0x9117,0);
      do {
        local_4b8 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_4b8 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_538,"Got Error ",&local_539);
          EVar13 = glu::getErrorStr(local_4b8);
          p_Stack_580 = EVar13.m_getName;
          local_578 = EVar13.m_value;
          local_570 = p_Stack_580;
          local_568 = local_578;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_560,&local_570);
          std::operator+(&local_518,&local_538,&local_560);
          std::operator+(&local_4f8,&local_518,": ");
          std::operator+(&local_4d8,&local_4f8,"fenceSync");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_4d8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::~string((string *)&local_538);
          std::allocator<char>::~allocator(&local_539);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      sync._0_4_ = (**(code **)(result.m_message.field_2._8_8_ + 0x3f0))(0x8b30);
      do {
        local_584 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_584 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_608,"Got Error ",&local_609);
          EVar13 = glu::getErrorStr(local_584);
          section.m_log = (TestLog *)EVar13.m_getName;
          local_638 = EVar13.m_value;
          local_640 = section.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_630,&local_640);
          std::operator+(&local_5e8,&local_608,&local_630);
          std::operator+(&local_5c8,&local_5e8,": ");
          std::operator+(&local_5a8,&local_5c8,"createShader");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_5a8);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::__cxx11::string::~string((string *)&local_630);
          std::__cxx11::string::~string((string *)&local_608);
          std::allocator<char>::~allocator(&local_609);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"Shader",&local_679);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a0,"Shader object",
                 (allocator<char> *)
                 &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
      tcu::ScopedLogSection::ScopedLogSection(&local_658,pTVar9,&local_678,&local_6a0);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
      std::__cxx11::string::~string((string *)&local_678);
      std::allocator<char>::~allocator(&local_679);
      sVar11 = (size_type)(int)shader;
      readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0x58;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_6c0,sVar11,
                 &readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17,
                 (allocator_type *)
                 &readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
      sVar11 = (size_type)(int)shader;
      local_6e1 = 'X';
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_6e0,sVar11,&local_6e1,&local_6e2);
      std::allocator<char>::~allocator(&local_6e2);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_6c0,(long)(int)(shader - 1))
      ;
      *pvVar12 = '\0';
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_868,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_868,
                           (char (*) [60])
                           "Setting max length label, with implicit size. (length = -1)");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_868);
      uVar3 = sync._0_4_;
      pcVar1 = *(code **)(result.m_message.field_2._8_8_ + 0xfc0);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_6c0,0);
      (*pcVar1)(0x82e1,uVar3,0xffffffff,pvVar12);
      do {
        local_86c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_86c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8f0,"Got Error ",&local_8f1);
          EVar13 = glu::getErrorStr(local_86c);
          local_938 = EVar13.m_getName;
          local_930 = EVar13.m_value;
          local_928 = local_938;
          local_920 = local_930;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_918,&local_928);
          std::operator+(&local_8d0,&local_8f0,&local_918);
          std::operator+(&local_8b0,&local_8d0,": ");
          std::operator+(&local_890,&local_8b0,"objectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_890);
          std::__cxx11::string::~string((string *)&local_890);
          std::__cxx11::string::~string((string *)&local_8b0);
          std::__cxx11::string::~string((string *)&local_8d0);
          std::__cxx11::string::~string((string *)&local_918);
          std::__cxx11::string::~string((string *)&local_8f0);
          std::allocator<char>::~allocator(&local_8f1);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_ab8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_ab8,(char (*) [20])"Querying label back");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_ab8);
      GVar4 = shader;
      uVar3 = sync._0_4_;
      sync._4_4_ = -1;
      pcVar1 = *(code **)(result.m_message.field_2._8_8_ + 0x958);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_6e0,0);
      (*pcVar1)(0x82e1,uVar3,GVar4,(long)&sync + 4,pvVar12);
      do {
        local_abc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_abc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b40,"Got Error ",&local_b41);
          EVar13 = glu::getErrorStr(local_abc);
          local_b88 = EVar13.m_getName;
          local_b80 = EVar13.m_value;
          local_b78 = local_b88;
          local_b70 = local_b80;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b68,&local_b78);
          std::operator+(&local_b20,&local_b40,&local_b68);
          std::operator+(&local_b00,&local_b20,": ");
          std::operator+(&local_ae0,&local_b00,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_ae0);
          std::__cxx11::string::~string((string *)&local_ae0);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_b20);
          std::__cxx11::string::~string((string *)&local_b68);
          std::__cxx11::string::~string((string *)&local_b40);
          std::allocator<char>::~allocator(&local_b41);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      if (sync._4_4_ == shader - 1) {
        pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_6e0,(long)sync._4_4_);
        if (*pvVar12 != '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c50,"Buffer was not null-terminated",&local_c51);
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_c50);
          std::__cxx11::string::~string((string *)&local_c50);
          std::allocator<char>::~allocator(&local_c51);
        }
      }
      else {
        local_c0c = shader - 1;
        de::toString<int>(&local_c08,&local_c0c);
        std::operator+(&local_be8,"\'length\' was not ",&local_c08);
        std::operator+(&local_bc8,&local_be8,", got ");
        de::toString<int>(&local_c30,(int *)((long)&sync + 4));
        std::operator+(&local_ba8,&local_bc8,&local_c30);
        tcu::ResultCollector::fail((ResultCollector *)local_80,&local_ba8);
        std::__cxx11::string::~string((string *)&local_ba8);
        std::__cxx11::string::~string((string *)&local_c30);
        std::__cxx11::string::~string((string *)&local_bc8);
        std::__cxx11::string::~string((string *)&local_be8);
        std::__cxx11::string::~string((string *)&local_c08);
      }
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&err_5,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&err_5,
                           (char (*) [57])"Setting max length label, with explicit size. (length = "
                          );
      local_ddc = shader - 1;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_ddc);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0xf2e642);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&err_5);
      uVar3 = sync._0_4_;
      pcVar1 = *(code **)(result.m_message.field_2._8_8_ + 0xfc0);
      iVar7 = shader - 1;
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_6c0,0);
      (*pcVar1)(0x82e1,uVar3,iVar7,pvVar12);
      do {
        local_de0 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_de0 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e60,"Got Error ",&local_e61);
          EVar13 = glu::getErrorStr(local_de0);
          local_ea8 = EVar13.m_getName;
          local_ea0 = EVar13.m_value;
          local_e98 = local_ea8;
          local_e90 = local_ea0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e88,&local_e98);
          std::operator+(&local_e40,&local_e60,&local_e88);
          std::operator+(&local_e20,&local_e40,": ");
          std::operator+(&local_e00,&local_e20,"objectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_e00);
          std::__cxx11::string::~string((string *)&local_e00);
          std::__cxx11::string::~string((string *)&local_e20);
          std::__cxx11::string::~string((string *)&local_e40);
          std::__cxx11::string::~string((string *)&local_e88);
          std::__cxx11::string::~string((string *)&local_e60);
          std::allocator<char>::~allocator(&local_e61);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1028,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1028,(char (*) [20])"Querying label back");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1028);
      sync._4_4_ = -1;
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_6e0,(long)(int)(shader - 1))
      ;
      GVar4 = shader;
      uVar3 = sync._0_4_;
      *pvVar12 = 'X';
      pcVar1 = *(code **)(result.m_message.field_2._8_8_ + 0x958);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_6e0,0);
      (*pcVar1)(0x82e1,uVar3,GVar4,(long)&sync + 4,pvVar12);
      do {
        local_102c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_102c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_10b0,"Got Error ",&local_10b1);
          EVar13 = glu::getErrorStr(local_102c);
          local_10f8 = EVar13.m_getName;
          local_10f0 = EVar13.m_value;
          local_10e8 = local_10f8;
          local_10e0 = local_10f0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_10d8,&local_10e8);
          std::operator+(&local_1090,&local_10b0,&local_10d8);
          std::operator+(&local_1070,&local_1090,": ");
          std::operator+(&local_1050,&local_1070,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1050);
          std::__cxx11::string::~string((string *)&local_1050);
          std::__cxx11::string::~string((string *)&local_1070);
          std::__cxx11::string::~string((string *)&local_1090);
          std::__cxx11::string::~string((string *)&local_10d8);
          std::__cxx11::string::~string((string *)&local_10b0);
          std::allocator<char>::~allocator(&local_10b1);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      if (sync._4_4_ == shader - 1) {
        pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_6e0,(long)sync._4_4_);
        if (*pvVar12 != '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_11c0,"Buffer was not null-terminated",
                     (allocator<char> *)((long)&section_1.m_log + 7));
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_11c0);
          std::__cxx11::string::~string((string *)&local_11c0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
        }
      }
      else {
        local_117c = shader - 1;
        de::toString<int>(&local_1178,&local_117c);
        std::operator+(&local_1158,"\'length\' was not ",&local_1178);
        std::operator+(&local_1138,&local_1158,", got ");
        de::toString<int>(&local_11a0,(int *)((long)&sync + 4));
        std::operator+(&local_1118,&local_1138,&local_11a0);
        tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1118);
        std::__cxx11::string::~string((string *)&local_1118);
        std::__cxx11::string::~string((string *)&local_11a0);
        std::__cxx11::string::~string((string *)&local_1138);
        std::__cxx11::string::~string((string *)&local_1158);
        std::__cxx11::string::~string((string *)&local_1178);
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_6e0);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_6c0);
      tcu::ScopedLogSection::~ScopedLogSection(&local_658);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_11f0,"Sync",&local_11f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1218,"Sync object",
                 (allocator<char> *)
                 &buffer_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
      tcu::ScopedLogSection::ScopedLogSection(&local_11d0,pTVar9,&local_11f0,&local_1218);
      std::__cxx11::string::~string((string *)&local_1218);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &buffer_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
      std::__cxx11::string::~string((string *)&local_11f0);
      std::allocator<char>::~allocator(&local_11f1);
      sVar11 = (size_type)(int)shader;
      readBuffer_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0x58;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_1238,sVar11,
                 &readBuffer_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17,
                 (allocator_type *)
                 &readBuffer_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &readBuffer_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
      sVar11 = (size_type)(int)shader;
      local_1259 = 'X';
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_1258,sVar11,&local_1259,&local_125a);
      std::allocator<char>::~allocator(&local_125a);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_1238,(long)(int)(shader - 1)
                          );
      *pvVar12 = '\0';
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_13e0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_13e0,
                           (char (*) [60])
                           "Setting max length label, with implicit size. (length = -1)");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_13e0);
      uVar2 = uStack_b8;
      pcVar1 = *(code **)(result.m_message.field_2._8_8_ + 0xfc8);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_1238,0);
      (*pcVar1)(uVar2,0xffffffff,pvVar12);
      do {
        local_13e4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_13e4 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1468,"Got Error ",&local_1469);
          EVar13 = glu::getErrorStr(local_13e4);
          local_14b0 = EVar13.m_getName;
          local_14a8 = EVar13.m_value;
          local_14a0 = local_14b0;
          local_1498 = local_14a8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1490,&local_14a0);
          std::operator+(&local_1448,&local_1468,&local_1490);
          std::operator+(&local_1428,&local_1448,": ");
          std::operator+(&local_1408,&local_1428,"objectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1408);
          std::__cxx11::string::~string((string *)&local_1408);
          std::__cxx11::string::~string((string *)&local_1428);
          std::__cxx11::string::~string((string *)&local_1448);
          std::__cxx11::string::~string((string *)&local_1490);
          std::__cxx11::string::~string((string *)&local_1468);
          std::allocator<char>::~allocator(&local_1469);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1630,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1630,(char (*) [20])"Querying label back");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1630);
      GVar4 = shader;
      uVar2 = uStack_b8;
      sync._4_4_ = -1;
      pcVar1 = *(code **)(result.m_message.field_2._8_8_ + 0x960);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_1258,0);
      (*pcVar1)(uVar2,GVar4,(long)&sync + 4,pvVar12);
      do {
        local_1634 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1634 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_16b8,"Got Error ",&local_16b9);
          EVar13 = glu::getErrorStr(local_1634);
          local_1700 = EVar13.m_getName;
          local_16f8 = EVar13.m_value;
          local_16f0 = local_1700;
          local_16e8 = local_16f8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_16e0,&local_16f0);
          std::operator+(&local_1698,&local_16b8,&local_16e0);
          std::operator+(&local_1678,&local_1698,": ");
          std::operator+(&local_1658,&local_1678,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1658);
          std::__cxx11::string::~string((string *)&local_1658);
          std::__cxx11::string::~string((string *)&local_1678);
          std::__cxx11::string::~string((string *)&local_1698);
          std::__cxx11::string::~string((string *)&local_16e0);
          std::__cxx11::string::~string((string *)&local_16b8);
          std::allocator<char>::~allocator(&local_16b9);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      if (sync._4_4_ == shader - 1) {
        pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_1258,(long)sync._4_4_);
        if (*pvVar12 != '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_17c8,"Buffer was not null-terminated",&local_17c9);
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_17c8);
          std::__cxx11::string::~string((string *)&local_17c8);
          std::allocator<char>::~allocator(&local_17c9);
        }
      }
      else {
        local_1784 = shader - 1;
        de::toString<int>(&local_1780,&local_1784);
        std::operator+(&local_1760,"\'length\' was not ",&local_1780);
        std::operator+(&local_1740,&local_1760,", got ");
        de::toString<int>(&local_17a8,(int *)((long)&sync + 4));
        std::operator+(&local_1720,&local_1740,&local_17a8);
        tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1720);
        std::__cxx11::string::~string((string *)&local_1720);
        std::__cxx11::string::~string((string *)&local_17a8);
        std::__cxx11::string::~string((string *)&local_1740);
        std::__cxx11::string::~string((string *)&local_1760);
        std::__cxx11::string::~string((string *)&local_1780);
      }
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&err_9,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&err_9,
                           (char (*) [57])"Setting max length label, with explicit size. (length = "
                          );
      local_1954 = shader - 1;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1954);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0xf2e642);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&err_9);
      uVar2 = uStack_b8;
      pcVar1 = *(code **)(result.m_message.field_2._8_8_ + 0xfc8);
      iVar7 = shader - 1;
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_1238,0);
      (*pcVar1)(uVar2,iVar7,pvVar12);
      do {
        local_1958 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1958 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_19d8,"Got Error ",&local_19d9);
          EVar13 = glu::getErrorStr(local_1958);
          local_1a20 = EVar13.m_getName;
          local_1a18 = EVar13.m_value;
          local_1a10 = local_1a20;
          local_1a08 = local_1a18;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1a00,&local_1a10);
          std::operator+(&local_19b8,&local_19d8,&local_1a00);
          std::operator+(&local_1998,&local_19b8,": ");
          std::operator+(&local_1978,&local_1998,"objectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1978);
          std::__cxx11::string::~string((string *)&local_1978);
          std::__cxx11::string::~string((string *)&local_1998);
          std::__cxx11::string::~string((string *)&local_19b8);
          std::__cxx11::string::~string((string *)&local_1a00);
          std::__cxx11::string::~string((string *)&local_19d8);
          std::allocator<char>::~allocator(&local_19d9);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1ba0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1ba0,(char (*) [20])"Querying label back");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1ba0);
      sync._4_4_ = -1;
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_1258,(long)(int)(shader - 1)
                          );
      GVar4 = shader;
      uVar2 = uStack_b8;
      *pvVar12 = 'X';
      pcVar1 = *(code **)(result.m_message.field_2._8_8_ + 0x960);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_1258,0);
      (*pcVar1)(uVar2,GVar4,(long)&sync + 4,pvVar12);
      do {
        local_1ba4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1ba4 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c28,"Got Error ",&local_1c29);
          EVar13 = glu::getErrorStr(local_1ba4);
          local_1c70 = EVar13.m_getName;
          local_1c68 = EVar13.m_value;
          local_1c60 = local_1c70;
          local_1c58 = local_1c68;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1c50,&local_1c60);
          std::operator+(&local_1c08,&local_1c28,&local_1c50);
          std::operator+(&local_1be8,&local_1c08,": ");
          std::operator+(&local_1bc8,&local_1be8,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1bc8);
          std::__cxx11::string::~string((string *)&local_1bc8);
          std::__cxx11::string::~string((string *)&local_1be8);
          std::__cxx11::string::~string((string *)&local_1c08);
          std::__cxx11::string::~string((string *)&local_1c50);
          std::__cxx11::string::~string((string *)&local_1c28);
          std::allocator<char>::~allocator(&local_1c29);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      if (sync._4_4_ == shader - 1) {
        pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_1258,(long)sync._4_4_);
        if (*pvVar12 != '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d38,"Buffer was not null-terminated",&local_1d39);
          tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1d38);
          std::__cxx11::string::~string((string *)&local_1d38);
          std::allocator<char>::~allocator(&local_1d39);
        }
      }
      else {
        local_1cf4 = shader - 1;
        de::toString<int>(&local_1cf0,&local_1cf4);
        std::operator+(&local_1cd0,"\'length\' was not ",&local_1cf0);
        std::operator+(&local_1cb0,&local_1cd0,", got ");
        de::toString<int>(&local_1d18,(int *)((long)&sync + 4));
        std::operator+(&local_1c90,&local_1cb0,&local_1d18);
        tcu::ResultCollector::fail((ResultCollector *)local_80,&local_1c90);
        std::__cxx11::string::~string((string *)&local_1c90);
        std::__cxx11::string::~string((string *)&local_1d18);
        std::__cxx11::string::~string((string *)&local_1cb0);
        std::__cxx11::string::~string((string *)&local_1cd0);
        std::__cxx11::string::~string((string *)&local_1cf0);
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_1258);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_1238);
      tcu::ScopedLogSection::~ScopedLogSection(&local_11d0);
      (**(code **)(result.m_message.field_2._8_8_ + 0x470))(sync._0_4_);
      (**(code **)(result.m_message.field_2._8_8_ + 0x478))(uStack_b8);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_80,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    }
    else {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&err_1,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&err_1,
                           (char (*) [96])
                           "GL_MAX_LABEL_LENGTH is very large. Application having larger labels is unlikely, skipping test."
                          );
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&err_1);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    local_4b4 = 1;
    tcu::ResultCollector::~ResultCollector((ResultCollector *)local_80);
    return STOP;
  }
  local_32a = 1;
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"maxLabelLen was less than required (256)",&local_329);
  tcu::TestError::TestError(this_01,&local_328);
  local_32a = 0;
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

LabelMaxSizeCase::IterateResult LabelMaxSizeCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxLabelLen	= -1;
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;

	gl.getIntegerv(GL_MAX_LABEL_LENGTH, &maxLabelLen);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "GL_MAX_LABEL_LENGTH");

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_LABEL_LENGTH = " << maxLabelLen << TestLog::EndMessage;

	if (maxLabelLen < 256)
		throw tcu::TestError("maxLabelLen was less than required (256)");
	if (maxLabelLen > 8192)
	{
		m_testCtx.getLog()
			<< TestLog::Message
			<< "GL_MAX_LABEL_LENGTH is very large. Application having larger labels is unlikely, skipping test."
			<< TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Shader", "Shader object");
		std::vector<char>			buffer		(maxLabelLen, 'X');
		std::vector<char>			readBuffer	(maxLabelLen, 'X');

		buffer[maxLabelLen-1] = '\0';

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with implicit size. (length = -1)" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with explicit size. (length = " << (maxLabelLen-1) << ")" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, maxLabelLen-1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		readBuffer[maxLabelLen-1] = 'X';
		gl.getObjectLabel(GL_SHADER, shader, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Sync", "Sync object");
		std::vector<char>			buffer		(maxLabelLen, 'X');
		std::vector<char>			readBuffer	(maxLabelLen, 'X');

		buffer[maxLabelLen-1] = '\0';

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with implicit size. (length = -1)" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with explicit size. (length = " << (maxLabelLen-1) << ")" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, maxLabelLen-1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		readBuffer[maxLabelLen-1] = 'X';
		gl.getObjectPtrLabel(sync, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}